

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baggage_types.cpp
# Opt level: O0

void __thiscall
jaegertracing::thrift::BaggageRestriction::BaggageRestriction
          (BaggageRestriction *this,BaggageRestriction *other0)

{
  BaggageRestriction *other0_local;
  BaggageRestriction *this_local;
  
  apache::thrift::TBase::TBase((TBase *)this);
  *(undefined ***)this = &PTR__BaggageRestriction_00518c90;
  *(undefined ***)this = &PTR__BaggageRestriction_00518c90;
  std::__cxx11::string::string((string *)&this->baggageKey);
  std::__cxx11::string::operator=((string *)&this->baggageKey,(string *)&other0->baggageKey);
  this->maxValueLength = other0->maxValueLength;
  return;
}

Assistant:

BaggageRestriction::BaggageRestriction(const BaggageRestriction& other0) {
  baggageKey = other0.baggageKey;
  maxValueLength = other0.maxValueLength;
}